

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O2

void __thiscall
helics::CommsInterface::loadNetworkInfo(CommsInterface *this,NetworkBrokerData *netInfo)

{
  size_type sVar1;
  int iVar2;
  bool bVar3;
  byte bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  
  bVar3 = propertyLock(this);
  if (!bVar3) {
    return;
  }
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &this->localTargetAddress;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (this_00,&netInfo->localInterface);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &this->brokerTargetAddress,&netInfo->brokerAddress);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->brokerName,
             &netInfo->brokerName);
  this->interfaceNetwork = netInfo->interfaceNetwork;
  iVar2 = netInfo->maxMessageCount;
  this->maxMessageSize = netInfo->maxMessageSize;
  this->maxMessageCount = iVar2;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &this->brokerInitString,&netInfo->brokerInitString);
  this->autoBroker = netInfo->autobroker;
  this->observer = netInfo->observer;
  bVar4 = netInfo->server_mode - SERVER_DEFAULT_ACTIVE;
  if (bVar4 < 4) {
    this->serverMode = SUB41(0x10001 >> ((bVar4 & 3) << 3),0);
  }
  sVar1 = (netInfo->connectionAddress)._M_string_length;
  if (this->mRequireBrokerConnection == true) {
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &this->brokerTargetAddress;
    if ((this->brokerTargetAddress)._M_string_length != 0 || sVar1 == 0) goto LAB_0024ba4d;
  }
  else if ((this->localTargetAddress)._M_string_length != 0 || sVar1 == 0) goto LAB_0024ba4d;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (this_00,&netInfo->connectionAddress);
LAB_0024ba4d:
  propertyUnLock(this);
  return;
}

Assistant:

void CommsInterface::loadNetworkInfo(const NetworkBrokerData& netInfo)
{
    if (propertyLock()) {
        localTargetAddress = netInfo.localInterface;
        brokerTargetAddress = netInfo.brokerAddress;
        brokerName = netInfo.brokerName;
        interfaceNetwork = netInfo.interfaceNetwork;
        maxMessageSize = netInfo.maxMessageSize;
        maxMessageCount = netInfo.maxMessageCount;
        brokerInitString = netInfo.brokerInitString;
        autoBroker = netInfo.autobroker;
        observer = netInfo.observer;
        switch (netInfo.server_mode) {
            case NetworkBrokerData::ServerModeOptions::SERVER_ACTIVE:
            case NetworkBrokerData::ServerModeOptions::SERVER_DEFAULT_ACTIVE:
                serverMode = true;
                break;
            case NetworkBrokerData::ServerModeOptions::SERVER_DEACTIVATED:
            case NetworkBrokerData::ServerModeOptions::SERVER_DEFAULT_DEACTIVATED:
                serverMode = false;
                break;
            case NetworkBrokerData::ServerModeOptions::UNSPECIFIED:
                break;
        }
        if (mRequireBrokerConnection) {
            if (brokerTargetAddress.empty() && !netInfo.connectionAddress.empty()) {
                brokerTargetAddress = netInfo.connectionAddress;
            }
        } else {
            if (localTargetAddress.empty() && !netInfo.connectionAddress.empty()) {
                localTargetAddress = netInfo.connectionAddress;
            }
        }
        propertyUnLock();
    }
}